

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O2

bool __thiscall anon_unknown.dwarf_e668::MovieState::prepare(MovieState *this)

{
  _Head_base<0UL,_AVIOContext_*,_false> this_00;
  AVFormatContext *this_01;
  int iVar1;
  ostream *poVar2;
  AVIOContext *ptr;
  AVFormatContext *ptr_00;
  AVFormatContext *pAVar3;
  long *local_40;
  thread local_38;
  AVFormatContext *fmtctx;
  AVIOContext *avioctx;
  AVIOInterruptCB intcb;
  
  avioctx = (AVIOContext *)0x0;
  intcb.callback = decode_interrupt_cb;
  ptr = (AVIOContext *)(this->mFilename)._M_dataplus._M_p;
  intcb.opaque = this;
  iVar1 = avio_open2(&avioctx,ptr,1,&intcb,0);
  if (iVar1 == 0) {
    this_00._M_head_impl =
         (this->mIOContext)._M_t.
         super___uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>._M_t.
         super__Tuple_impl<0UL,_AVIOContext_*,_(anonymous_namespace)::AVIOContextDeleter>.
         super__Head_base<0UL,_AVIOContext_*,_false>._M_head_impl;
    (this->mIOContext)._M_t.
    super___uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>._M_t.
    super__Tuple_impl<0UL,_AVIOContext_*,_(anonymous_namespace)::AVIOContextDeleter>.
    super__Head_base<0UL,_AVIOContext_*,_false>._M_head_impl = avioctx;
    if (this_00._M_head_impl != (AVIOContext *)0x0) {
      AVIOContextDeleter::operator()((AVIOContextDeleter *)this_00._M_head_impl,ptr);
    }
    fmtctx = (AVFormatContext *)avformat_alloc_context();
    fmtctx->pb = (this->mIOContext)._M_t.
                 super___uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>._M_t.
                 super__Tuple_impl<0UL,_AVIOContext_*,_(anonymous_namespace)::AVIOContextDeleter>.
                 super__Head_base<0UL,_AVIOContext_*,_false>._M_head_impl;
    *(undefined4 *)&(fmtctx->interrupt_callback).callback = intcb.callback._0_4_;
    *(undefined4 *)((long)&(fmtctx->interrupt_callback).callback + 4) = intcb.callback._4_4_;
    *(undefined4 *)&(fmtctx->interrupt_callback).opaque = intcb.opaque._0_4_;
    *(undefined4 *)((long)&(fmtctx->interrupt_callback).opaque + 4) = intcb.opaque._4_4_;
    ptr_00 = (AVFormatContext *)(this->mFilename)._M_dataplus._M_p;
    iVar1 = avformat_open_input(&fmtctx,ptr_00,0,0);
    if (iVar1 == 0) {
      this_01 = (this->mFormatCtx)._M_t.
                super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>.
                _M_t.
                super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>
                .super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl;
      (this->mFormatCtx)._M_t.
      super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>._M_t.
      super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>.
      super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl = fmtctx;
      pAVar3 = fmtctx;
      if (this_01 != (AVFormatContext *)0x0) {
        AVFormatCtxDeleter::operator()((AVFormatCtxDeleter *)this_01,ptr_00);
        pAVar3 = (this->mFormatCtx)._M_t.
                 super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>
                 .super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl;
      }
      iVar1 = avformat_find_stream_info(pAVar3,0);
      if (-1 < iVar1) {
        av_dump_format((this->mFormatCtx)._M_t.
                       super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>
                       .super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl,0,
                       (this->mFilename)._M_dataplus._M_p,0);
        local_38._M_id._M_thread = (id)0;
        local_40 = (long *)operator_new(0x20);
        *local_40 = (long)&PTR___State_0010ece0;
        local_40[1] = (long)this;
        local_40[2] = (long)parse_handler;
        local_40[3] = 0;
        std::thread::_M_start_thread(&local_38,&local_40,0);
        if (local_40 != (long *)0x0) {
          (**(code **)(*local_40 + 8))();
        }
        std::thread::operator=(&this->mParseThread,&local_38);
        std::thread::~thread(&local_38);
        return true;
      }
      poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&this->mFilename);
      poVar2 = std::operator<<(poVar2,": failed to find stream info");
      goto LAB_00106c99;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
  poVar2 = std::operator<<(poVar2,(string *)&this->mFilename);
LAB_00106c99:
  std::endl<char,std::char_traits<char>>(poVar2);
  return false;
}

Assistant:

bool MovieState::prepare()
{
    AVIOContext *avioctx{nullptr};
    AVIOInterruptCB intcb{decode_interrupt_cb, this};
    if(avio_open2(&avioctx, mFilename.c_str(), AVIO_FLAG_READ, &intcb, nullptr))
    {
        std::cerr<< "Failed to open "<<mFilename <<std::endl;
        return false;
    }
    mIOContext.reset(avioctx);

    /* Open movie file. If avformat_open_input fails it will automatically free
     * this context, so don't set it onto a smart pointer yet.
     */
    AVFormatContext *fmtctx{avformat_alloc_context()};
    fmtctx->pb = mIOContext.get();
    fmtctx->interrupt_callback = intcb;
    if(avformat_open_input(&fmtctx, mFilename.c_str(), nullptr, nullptr) != 0)
    {
        std::cerr<< "Failed to open "<<mFilename <<std::endl;
        return false;
    }
    mFormatCtx.reset(fmtctx);

    /* Retrieve stream information */
    if(avformat_find_stream_info(mFormatCtx.get(), nullptr) < 0)
    {
        std::cerr<< mFilename<<": failed to find stream info" <<std::endl;
        return false;
    }

    /* Dump information about file onto standard error */
    av_dump_format(mFormatCtx.get(), 0, mFilename.c_str(), 0);

    mParseThread = std::thread{std::mem_fn(&MovieState::parse_handler), this};
    return true;
}